

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O1

void __thiscall
kj::
Table<kj::TreeMap<int,_kj::StringPtr>::Entry,_kj::TreeIndex<kj::TreeMap<int,_kj::StringPtr>::Callbacks>_>
::eraseImpl(Table<kj::TreeMap<int,_kj::StringPtr>::Entry,_kj::TreeIndex<kj::TreeMap<int,_kj::StringPtr>::Callbacks>_>
            *this,size_t pos)

{
  size_t sVar1;
  undefined8 *puVar2;
  long lVar3;
  long lVar4;
  undefined8 uVar5;
  HashIndex<kj::_::(anonymous_namespace)::StringHasher> *indexObj;
  uint row;
  long local_68;
  long local_60;
  SearchKey local_58;
  Table<kj::TreeMap<int,_kj::StringPtr>::Entry,_kj::TreeIndex<kj::TreeMap<int,_kj::StringPtr>::Callbacks>_>
  *local_50;
  Table<kj::TreeMap<int,_kj::StringPtr>::Entry,_kj::TreeIndex<kj::TreeMap<int,_kj::StringPtr>::Callbacks>_>
  *local_48;
  long *local_40;
  long local_38;
  
  local_68 = *(long *)this;
  local_38 = local_68 + pos * 0x18;
  local_60 = (*(long *)(this + 8) - local_68 >> 3) * -0x5555555555555555;
  local_58._vptr_SearchKey = (_func_char_7_ **)&PTR_search_00237448;
  row = (uint)pos;
  local_50 = (Table<kj::TreeMap<int,_kj::StringPtr>::Entry,_kj::TreeIndex<kj::TreeMap<int,_kj::StringPtr>::Callbacks>_>
              *)CONCAT44(local_50._4_4_,row);
  local_48 = this + 0x20;
  local_40 = &local_68;
  _::BTreeImpl::erase((BTreeImpl *)(this + 0x28),row,&local_58);
  local_68 = *(long *)this;
  local_60 = (*(long *)(this + 8) - local_68 >> 3) * -0x5555555555555555;
  sVar1 = local_60 - 1;
  if (sVar1 != pos) {
    lVar4 = sVar1 * 0x18;
    local_40 = (long *)(local_68 + lVar4);
    local_58._vptr_SearchKey = (_func_char_7_ **)&PTR_search_00237408;
    local_50 = this + 0x20;
    local_48 = (Table<kj::TreeMap<int,_kj::StringPtr>::Entry,_kj::TreeIndex<kj::TreeMap<int,_kj::StringPtr>::Callbacks>_>
                *)&local_68;
    _::BTreeImpl::renumber((BTreeImpl *)(this + 0x28),(uint)sVar1,row,&local_58);
    lVar3 = *(long *)this;
    *(undefined8 *)(lVar3 + 0x10 + pos * 0x18) = *(undefined8 *)(lVar3 + 0x10 + lVar4);
    uVar5 = ((undefined8 *)(lVar3 + lVar4))[1];
    puVar2 = (undefined8 *)(lVar3 + pos * 0x18);
    *puVar2 = *(undefined8 *)(lVar3 + lVar4);
    puVar2[1] = uVar5;
  }
  *(long *)(this + 8) = *(long *)(this + 8) + -0x18;
  return;
}

Assistant:

void Table<Row, Indexes...>::eraseImpl(size_t pos) {
  Impl<>::erase(*this, pos, rows[pos]);
  size_t back = rows.size() - 1;
  if (pos != back) {
    Impl<>::move(*this, back, pos, rows[back]);
    rows[pos] = kj::mv(rows[back]);
  }
  rows.removeLast();
}